

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_write.cpp
# Opt level: O3

void __thiscall
ritobin::io::text_write_impl::BinTextWriter::write_item(BinTextWriter *this,Field *item)

{
  vector<char,_std::allocator<char>_> *this_00;
  value_type local_11;
  
  this_00 = (this->writer).buffer_;
  std::vector<char,_std::allocator<char>_>::_M_fill_insert
            (this_00,(iterator)
                     (this_00->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish,(this->writer).ident_,&local_11);
  TextWriter::write_name(&this->writer,&item->key);
  TextWriter::write_raw<3ul>(&this->writer,(char (*) [3])0x13906c);
  write_type(this,&item->value);
  TextWriter::write_raw<4ul>(&this->writer,(char (*) [4])" = ");
  write_value(this,&item->value);
  TextWriter::write_raw<2ul>(&this->writer,(char (*) [2])0x13aee0);
  return;
}

Assistant:

void write_item(Field const& item) {
            writer.pad();
            writer.write_name(item.key);
            writer.write_raw(": ");
            write_type(item.value);
            writer.write_raw(" = ");
            write_value(item.value);
            writer.write_raw("\n");
        }